

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# baggage_types.cpp
# Opt level: O0

void __thiscall
jaegertracing::thrift::BaggageRestriction::printTo(BaggageRestriction *this,ostream *out)

{
  ostream *poVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t;
  string local_68;
  string local_38;
  ostream *local_18;
  ostream *out_local;
  BaggageRestriction *this_local;
  
  local_18 = out;
  out_local = (ostream *)this;
  std::operator<<(out,"BaggageRestriction(");
  poVar1 = std::operator<<(local_18,"baggageKey=");
  apache::thrift::to_string<std::__cxx11::string>(&local_38,(thrift *)&this->baggageKey,t);
  std::operator<<(poVar1,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  poVar1 = std::operator<<(local_18,", ");
  poVar1 = std::operator<<(poVar1,"maxValueLength=");
  apache::thrift::to_string<int>(&local_68,&this->maxValueLength);
  std::operator<<(poVar1,(string *)&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::operator<<(local_18,")");
  return;
}

Assistant:

void BaggageRestriction::printTo(std::ostream& out) const {
  using ::apache::thrift::to_string;
  out << "BaggageRestriction(";
  out << "baggageKey=" << to_string(baggageKey);
  out << ", " << "maxValueLength=" << to_string(maxValueLength);
  out << ")";
}